

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_table.c
# Opt level: O0

aom_codec_err_t
aom_film_grain_table_write
          (aom_film_grain_table_t *t,char *filename,aom_internal_error_info *error_info)

{
  FILE *__s;
  size_t sVar1;
  aom_internal_error_info *in_RDX;
  char *in_RSI;
  long *in_RDI;
  aom_film_grain_table_entry_t *entry;
  FILE *file;
  aom_film_grain_table_entry_t *in_stack_00000030;
  FILE *in_stack_00000038;
  long local_30;
  aom_codec_err_t local_4;
  
  in_RDX->error_code = AOM_CODEC_OK;
  __s = fopen64(in_RSI,"wb");
  if (__s == (FILE *)0x0) {
    aom_internal_error(in_RDX,AOM_CODEC_ERROR,"Unable to open file %s",in_RSI);
    local_4 = in_RDX->error_code;
  }
  else {
    sVar1 = fwrite("filmgrn1",8,1,__s);
    if (sVar1 == 0) {
      aom_internal_error(in_RDX,AOM_CODEC_ERROR,"Unable to write file magic");
      fclose(__s);
      local_4 = in_RDX->error_code;
    }
    else {
      fprintf(__s,"\n");
      for (local_30 = *in_RDI; local_30 != 0; local_30 = *(long *)(local_30 + 0x298)) {
        grain_table_entry_write(in_stack_00000038,in_stack_00000030);
      }
      fclose(__s);
      local_4 = in_RDX->error_code;
    }
  }
  return local_4;
}

Assistant:

aom_codec_err_t aom_film_grain_table_write(
    const aom_film_grain_table_t *t, const char *filename,
    struct aom_internal_error_info *error_info) {
  error_info->error_code = AOM_CODEC_OK;

  FILE *file = fopen(filename, "wb");
  if (!file) {
    aom_internal_error(error_info, AOM_CODEC_ERROR, "Unable to open file %s",
                       filename);
    return error_info->error_code;
  }

  if (!fwrite(kFileMagic, 8, 1, file)) {
    aom_internal_error(error_info, AOM_CODEC_ERROR,
                       "Unable to write file magic");
    fclose(file);
    return error_info->error_code;
  }

  fprintf(file, "\n");
  aom_film_grain_table_entry_t *entry = t->head;
  while (entry) {
    grain_table_entry_write(file, entry);
    entry = entry->next;
  }
  fclose(file);
  return error_info->error_code;
}